

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall QGraphicsScene::~QGraphicsScene(QGraphicsScene *this)

{
  QGraphicsView **ppQVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QGraphicsView_*> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR_metaObject_007ed5a0;
  lVar2 = *(long *)(this + 8);
  if ((char)QCoreApplicationPrivate::is_app_closing == '\0') {
    local_40.d = (Data *)this;
    QtPrivate::sequential_erase_with_copy<QList<QGraphicsScene*>,QGraphicsScene*>
              ((QList<QGraphicsScene_*> *)(*(long *)(QCoreApplication::self + 8) + 0x178),
               (QGraphicsScene **)&local_40);
  }
  clear(this);
  local_40.d = *(Data **)(lVar2 + 0x280);
  ppQVar1 = *(QGraphicsView ***)(lVar2 + 0x288);
  local_40.size = *(long *)(lVar2 + 0x290);
  if (local_40.d != (Data *)0x0) {
    LOCK();
    ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  lVar3 = local_40.size * 8;
  local_40.ptr = ppQVar1;
  for (lVar2 = 0; lVar3 != lVar2; lVar2 = lVar2 + 8) {
    QGraphicsView::setScene(*(QGraphicsView **)((long)ppQVar1 + lVar2),(QGraphicsScene *)0x0);
  }
  QArrayDataPointer<QGraphicsView_*>::~QArrayDataPointer(&local_40);
  QObject::~QObject((QObject *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QGraphicsScene::~QGraphicsScene()
{
    Q_D(QGraphicsScene);

    // Remove this scene from qApp's global scene list.
    if (!QApplicationPrivate::is_app_closing)
        qApp->d_func()->scene_list.removeAll(this);

    clear();

    // Remove this scene from all associated views.
    // Note: d->views is modified by QGraphicsView::setScene, so must make a copy
    const auto views = d->views;
    for (auto view : std::as_const(views))
        view->setScene(nullptr);
}